

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O3

void __thiscall SortByPTypeProcessTest::SetUp(SortByPTypeProcessTest *this)

{
  SortByPTypeProcessTest *pSVar1;
  SortByPTypeProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar2;
  aiMesh *paVar3;
  undefined8 *puVar4;
  aiVector3D *paVar5;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  uint *puVar6;
  aiNode *paVar7;
  aiNode **ppaVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  aiFace *paVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  uint local_7c;
  undefined8 local_68;
  undefined8 uStack_60;
  aiMesh *local_58;
  ulong local_50;
  aiVector3D *local_48;
  SortByPTypeProcessTest *local_40;
  long local_38;
  
  this_00 = (SortByPTypeProcess *)operator_new(0x20);
  Assimp::SortByPTypeProcess::SortByPTypeProcess(this_00);
  this->mProcess1 = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->mScene = this_01;
  this_01->mNumMeshes = 10;
  ppaVar2 = (aiMesh **)operator_new__(0x50);
  this_01->mMeshes = ppaVar2;
  lVar14 = 0;
  local_50 = 0;
  local_40 = this;
  do {
    pSVar1 = local_40;
    paVar3 = (aiMesh *)operator_new(0x520);
    paVar3->mPrimitiveTypes = 0;
    paVar3->mNumVertices = 0;
    paVar3->mNumFaces = 0;
    memset(&paVar3->mVertices,0,0xcc);
    paVar3->mBones = (aiBone **)0x0;
    paVar3->mMaterialIndex = 0;
    (paVar3->mName).length = 0;
    (paVar3->mName).data[0] = '\0';
    memset((paVar3->mName).data + 1,0x1b,0x3ff);
    paVar3->mNumAnimMeshes = 0;
    paVar3->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar3->mMethod = 0;
    (paVar3->mAABB).mMin.x = 0.0;
    (paVar3->mAABB).mMin.y = 0.0;
    (paVar3->mAABB).mMin.z = 0.0;
    (paVar3->mAABB).mMax.x = 0.0;
    (paVar3->mAABB).mMax.y = 0.0;
    (paVar3->mAABB).mMax.z = 0.0;
    memset(paVar3->mColors,0,0xa0);
    pSVar1->mScene->mMeshes[lVar14] = paVar3;
    paVar3->mNumFaces = 1000;
    local_58 = paVar3;
    puVar4 = (undefined8 *)operator_new__(0x3e88);
    paVar3 = local_58;
    *puVar4 = 1000;
    lVar10 = 0x10;
    do {
      *(undefined4 *)((long)puVar4 + lVar10 + -8) = 0;
      *(undefined8 *)((long)puVar4 + lVar10) = 0;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x3e90);
    paVar12 = (aiFace *)(puVar4 + 1);
    local_58->mFaces = paVar12;
    paVar5 = (aiVector3D *)operator_new__(60000);
    memset(paVar5,0,60000);
    paVar3->mVertices = paVar5;
    local_48 = paVar5;
    paVar5 = (aiVector3D *)operator_new__(60000);
    memset(paVar5,0,60000);
    paVar3->mNormals = paVar5;
    __s = (aiVector3D *)operator_new__(60000);
    memset(__s,0,60000);
    paVar3->mTangents = __s;
    __s_00 = (aiVector3D *)operator_new__(60000);
    memset(__s_00,0,60000);
    paVar3->mBitangents = __s_00;
    __s_01 = (aiVector3D *)operator_new__(60000);
    memset(__s_01,0,60000);
    paVar3->mTextureCoords[0] = __s_01;
    local_38 = lVar14;
    uVar9 = 0;
    local_68 = *(undefined8 *)::num[lVar14];
    uStack_60 = *(undefined8 *)(::num[lVar14] + 2);
    local_7c = 0;
    do {
      uVar15 = uVar9 & 3;
      while( true ) {
        uVar16 = (ulong)uVar15;
        iVar13 = *(int *)((long)&local_68 + uVar16 * 4);
        if (iVar13 != 0) break;
        uVar15 = uVar15 + 1;
        if (uVar15 == 4) {
          uVar15 = 0;
        }
      }
      uVar15 = uVar15 + 1;
      paVar12->mNumIndices = uVar15;
      if (uVar15 == 4) {
        uVar15 = 4;
        if ((local_50 & 1) != 0) {
          paVar12->mNumIndices = 5;
          uVar15 = 5;
        }
        local_50 = local_50 ^ 1;
      }
      puVar6 = (uint *)operator_new__((ulong)uVar15 << 2);
      paVar12->mIndices = puVar6;
      if (uVar15 != 0) {
        uVar11 = 0;
        lVar14 = 0;
        do {
          lVar10 = lVar14;
          paVar12->mIndices[uVar11] = local_7c + (int)uVar11;
          fVar17 = (float)*(uint *)((long)&local_68 + uVar16 * 4);
          fVar18 = (float)(uVar11 & 0xffffffff) + fVar17;
          *(float *)((long)&local_48->x + lVar10) = fVar17;
          *(float *)((long)&paVar5->x + lVar10) = fVar17;
          *(float *)((long)&__s->x + lVar10) = fVar17;
          *(float *)((long)&__s_00->x + lVar10) = fVar17;
          *(float *)((long)&__s_01->x + lVar10) = fVar17;
          fVar17 = fVar17 + 1.0;
          *(float *)((long)&local_48->y + lVar10) = fVar17;
          *(float *)((long)&local_48->z + lVar10) = fVar18;
          *(float *)((long)&paVar5->y + lVar10) = fVar17;
          *(float *)((long)&paVar5->z + lVar10) = fVar18;
          *(float *)((long)&__s->y + lVar10) = fVar17;
          *(float *)((long)&__s->z + lVar10) = fVar18;
          *(float *)((long)&__s_00->y + lVar10) = fVar17;
          *(float *)((long)&__s_00->z + lVar10) = fVar18;
          *(float *)((long)&__s_01->y + lVar10) = fVar17;
          *(float *)((long)&__s_01->z + lVar10) = fVar18;
          uVar11 = uVar11 + 1;
          lVar14 = lVar10 + 0xc;
        } while (uVar11 < paVar12->mNumIndices);
        iVar13 = *(int *)((long)&local_68 + uVar16 * 4);
        local_7c = local_7c + (int)uVar11;
        __s_01 = (aiVector3D *)((long)&__s_01[1].x + lVar10);
        __s_00 = (aiVector3D *)((long)&__s_00[1].x + lVar10);
        __s = (aiVector3D *)((long)&__s[1].x + lVar10);
        paVar5 = (aiVector3D *)((long)&paVar5[1].x + lVar10);
        local_48 = (aiVector3D *)((long)&local_48[1].x + lVar10);
      }
      paVar12 = paVar12 + 1;
      *(int *)((long)&local_68 + uVar16 * 4) = iVar13 + -1;
      pSVar1 = local_40;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 1000);
    local_58->mNumVertices = local_7c;
    lVar14 = local_38 + 1;
  } while (lVar14 != 10);
  paVar7 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar7);
  pSVar1->mScene->mRootNode = paVar7;
  pSVar1->mScene->mRootNode->mNumChildren = 5;
  ppaVar8 = (aiNode **)operator_new__(0x28);
  pSVar1->mScene->mRootNode->mChildren = ppaVar8;
  lVar14 = 0;
  do {
    paVar7 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar7);
    *(aiNode **)((long)pSVar1->mScene->mRootNode->mChildren + lVar14 * 4) = paVar7;
    paVar7->mNumMeshes = 2;
    puVar6 = (uint *)operator_new__(8);
    paVar7->mMeshes = puVar6;
    *puVar6 = (uint)lVar14;
    puVar6[1] = (uint)lVar14 + 1;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 10);
  return;
}

Assistant:

void SortByPTypeProcessTest::SetUp() {
    mProcess1 = new SortByPTypeProcess();
    mScene = new aiScene();

    mScene->mNumMeshes = 10;
    mScene->mMeshes = new aiMesh*[10];

    bool five = false;
    for (unsigned int i = 0; i < 10; ++i) {
        aiMesh* mesh = mScene->mMeshes[i] = new aiMesh();
        mesh->mNumFaces = 1000;
        aiFace* faces =  mesh->mFaces = new aiFace[1000];
        aiVector3D* pv = mesh->mVertices = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pn = mesh->mNormals = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* pt = mesh->mTangents = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pb = mesh->mBitangents = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* puv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumFaces*5];

        unsigned int remaining[4] = {num[i][0],num[i][1],num[i][2],num[i][3]};
        unsigned int n = 0;
        for (unsigned int m = 0; m < 1000; ++m) {
            unsigned int idx = m % 4;
            while (true) {
                if (!remaining[idx]) {
                    if (4 == ++idx) {
                        idx = 0;
                    }
                    continue;
                }
                break;
            }
            faces->mNumIndices = idx+1;
            if (4 == faces->mNumIndices) {
                if(five)++faces->mNumIndices;
                five = !five;
            }
            faces->mIndices = new unsigned int[faces->mNumIndices];
            for (unsigned int q = 0; q <faces->mNumIndices;++q,++n) {
                faces->mIndices[q] = n;
                float f = (float)remaining[idx];

                // (the values need to be unique - otherwise all degenerates would be removed)
                *pv++ = aiVector3D(f,f+1.f,f+q);
                *pn++ = aiVector3D(f,f+1.f,f+q);
                *pt++ = aiVector3D(f,f+1.f,f+q);
                *pb++ = aiVector3D(f,f+1.f,f+q);
                *puv++ = aiVector3D(f,f+1.f,f+q);
            }
            ++faces;
            --remaining[idx];
        }
        mesh->mNumVertices = n;
    }

    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mNumChildren = 5;
    mScene->mRootNode->mChildren = new aiNode*[5];
    for (unsigned int i = 0; i< 5;++i ) {
        aiNode* node = mScene->mRootNode->mChildren[i] = new aiNode();
        node->mNumMeshes = 2;
        node->mMeshes = new unsigned int[2];
        node->mMeshes[0] = (i<<1u);
        node->mMeshes[1] = (i<<1u)+1;
    }
}